

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::zesDriverGetDeviceByUuidExp
          (validation_layer *this,zes_driver_handle_t hDriver,zes_uuid_t uuid,
          zes_device_handle_t *phDevice,ze_bool_t *onSubdevice,uint32_t *subdeviceId)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  ze_result_t result;
  ze_result_t zVar5;
  long lVar6;
  zes_device_handle_t *phDevice_00;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  zes_uuid_t uuid_00;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar4 = context;
  phDevice_00 = uuid.id._8_8_;
  uVar7 = uuid.id._0_8_;
  lVar8 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "zesDriverGetDeviceByUuidExp(hDriver, uuid, phDevice, onSubdevice, subdeviceId)","");
  if (*(char *)(lVar8 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar8 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(lVar4 + 0x9f8);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar8 = *(long *)(lVar4 + 0xd30);
    lVar2 = *(long *)(lVar4 + 0xd38);
    lVar6 = lVar2 - lVar8 >> 3;
    if (lVar2 != lVar8) {
      lVar9 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(lVar4 + 0xd30) + lVar9 * 8) + 8);
        result = (**(code **)(*plVar3 + 0x890))
                           (plVar3,this,hDriver,uVar7,phDevice_00,phDevice,onSubdevice);
        if (result != ZE_RESULT_SUCCESS) goto LAB_00184e63;
        lVar9 = lVar9 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar9);
    }
    if ((*(char *)(lVar4 + 4) != '\x01') ||
       (uuid_00.id[8] = (char)uVar7, uuid_00.id[9] = (char)((ulong)uVar7 >> 8),
       uuid_00.id[10] = (char)((ulong)uVar7 >> 0x10), uuid_00.id[0xb] = (char)((ulong)uVar7 >> 0x18)
       , uuid_00.id[0xc] = (char)((ulong)uVar7 >> 0x20),
       uuid_00.id[0xd] = (char)((ulong)uVar7 >> 0x28),
       uuid_00.id[0xe] = (char)((ulong)uVar7 >> 0x30),
       uuid_00.id[0xf] = (char)((ulong)uVar7 >> 0x38), uuid_00.id._0_8_ = hDriver,
       result = ZESHandleLifetimeValidation::zesDriverGetDeviceByUuidExpPrologue
                          ((ZESHandleLifetimeValidation *)(*(long *)(lVar4 + 0xd48) + 8),
                           (zes_driver_handle_t)this,uuid_00,phDevice_00,(ze_bool_t *)phDevice,
                           (uint32_t *)onSubdevice), result == ZE_RESULT_SUCCESS)) {
      zVar5 = (*pcVar1)(this,hDriver,uVar7,phDevice_00,phDevice,onSubdevice);
      if (lVar2 != lVar8) {
        lVar8 = 0;
        do {
          plVar3 = *(long **)(*(long *)(*(long *)(lVar4 + 0xd30) + lVar8 * 8) + 8);
          result = (**(code **)(*plVar3 + 0x898))
                             (plVar3,this,hDriver,uVar7,phDevice_00,phDevice,onSubdevice,zVar5);
          if (result != ZE_RESULT_SUCCESS) goto LAB_00184e63;
          lVar8 = lVar8 + 1;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
      }
      result = zVar5;
      if (((zVar5 == ZE_RESULT_SUCCESS) && (phDevice_00 != (zes_device_handle_t *)0x0)) &&
         (*(char *)(lVar4 + 4) != '\0')) {
        HandleLifetimeValidation::addHandle
                  (*(HandleLifetimeValidation **)(lVar4 + 0xd48),*phDevice_00);
        HandleLifetimeValidation::addDependent
                  (*(HandleLifetimeValidation **)(lVar4 + 0xd48),this,*phDevice_00);
      }
    }
  }
LAB_00184e63:
  logAndPropagateResult("zesDriverGetDeviceByUuidExp",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDriverGetDeviceByUuidExp(
        zes_driver_handle_t hDriver,                    ///< [in] handle of the sysman driver instance
        zes_uuid_t uuid,                                ///< [in] universal unique identifier.
        zes_device_handle_t* phDevice,                  ///< [out] Sysman handle of the device.
        ze_bool_t* onSubdevice,                         ///< [out] True if the UUID belongs to the sub-device; false means that
                                                        ///< UUID belongs to the root device.
        uint32_t* subdeviceId                           ///< [out] If onSubdevice is true, this gives the ID of the sub-device
        )
    {
        context.logger->log_trace("zesDriverGetDeviceByUuidExp(hDriver, uuid, phDevice, onSubdevice, subdeviceId)");

        auto pfnGetDeviceByUuidExp = context.zesDdiTable.DriverExp.pfnGetDeviceByUuidExp;

        if( nullptr == pfnGetDeviceByUuidExp )
            return logAndPropagateResult("zesDriverGetDeviceByUuidExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDriverGetDeviceByUuidExpPrologue( hDriver, uuid, phDevice, onSubdevice, subdeviceId );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDriverGetDeviceByUuidExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesDriverGetDeviceByUuidExpPrologue( hDriver, uuid, phDevice, onSubdevice, subdeviceId );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDriverGetDeviceByUuidExp", result);
        }

        auto driver_result = pfnGetDeviceByUuidExp( hDriver, uuid, phDevice, onSubdevice, subdeviceId );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDriverGetDeviceByUuidExpEpilogue( hDriver, uuid, phDevice, onSubdevice, subdeviceId ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDriverGetDeviceByUuidExp", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phDevice){
                context.handleLifetime->addHandle( *phDevice );
                context.handleLifetime->addDependent( hDriver, *phDevice );

            }
        }
        return logAndPropagateResult("zesDriverGetDeviceByUuidExp", driver_result);
    }